

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O2

double __thiscall fizplex::LP::get_value(LP *this,size_t row,size_t column)

{
  uint __line;
  char *__assertion;
  double dVar1;
  
  if (row < (ulong)(((long)(this->rows).
                           super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->rows).
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    if (column < (ulong)(((long)(this->cols).
                                super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->cols).
                               super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      dVar1 = ColMatrix::get_value(&this->A,row,column);
      return dVar1;
    }
    __assertion = "column < column_count()";
    __line = 0x48;
  }
  else {
    __assertion = "row < row_count()";
    __line = 0x47;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc",
                __line,"double fizplex::LP::get_value(size_t, size_t) const");
}

Assistant:

double LP::get_value(size_t row, size_t column) const {
  assert(row < row_count());
  assert(column < column_count());

  return A.get_value(row, column);
}